

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

ly_set * lyd_find_instance(lyd_node *data,lys_node *schema)

{
  lyd_node **pplVar1;
  lyd_node *plVar2;
  ly_set *set;
  ly_set *set_00;
  long lVar3;
  ly_set *set_01;
  uint uVar4;
  lyd_node *node;
  ulong uVar5;
  lys_node *plVar6;
  lys_node **pplVar7;
  
  if ((schema == (lys_node *)0x0 || data == (lyd_node *)0x0) ||
     ((schema->nodetype & 0xc1bd) == LYS_UNKNOWN)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_find_instance");
    return (ly_set *)0x0;
  }
  set = ly_set_new();
  set_00 = ly_set_new();
  if (set_00 != (ly_set *)0x0 && set != (ly_set *)0x0) {
    do {
      pplVar1 = &data->parent;
      plVar2 = data;
      data = *pplVar1;
    } while (*pplVar1 != (lyd_node *)0x0);
    do {
      node = plVar2;
      plVar2 = node->prev;
    } while (node->prev->next != (lyd_node *)0x0);
    for (plVar6 = schema; plVar6 != (lys_node *)0x0;
        plVar6 = *(lys_node **)(plVar6->padding + lVar3 + -0x1c)) {
      lVar3 = 0x58;
      if ((plVar6->nodetype != LYS_AUGMENT) &&
         (lVar3 = 0x40, (plVar6->nodetype & 0xc1bd) != LYS_UNKNOWN)) {
        ly_set_add(set_00,plVar6,1);
      }
    }
    if (set_00->number == 0) goto LAB_001675d9;
    for (; node != (lyd_node *)0x0; node = node->next) {
      if (node->schema == (set_00->set).s[set_00->number - 1]) {
        ly_set_add(set,node,1);
      }
    }
    uVar4 = set_00->number;
    while( true ) {
      if ((uVar4 - 1 == 0) || (set->number == 0)) {
        ly_set_free(set_00);
        return set;
      }
      set_01 = ly_set_new();
      if (set_01 == (ly_set *)0x0) break;
      for (uVar5 = 0; uVar5 < set->number; uVar5 = uVar5 + 1) {
        pplVar7 = &(set->set).s[uVar5]->parent;
        while (plVar6 = *pplVar7, plVar6 != (lys_node *)0x0) {
          if ((lys_node *)plVar6->name == (set_00->set).s[uVar4 - 2]) {
            ly_set_add(set_01,plVar6,1);
          }
          pplVar7 = (lys_node **)&plVar6->flags;
        }
      }
      ly_set_free(set);
      set = set_01;
      uVar4 = uVar4 - 1;
    }
  }
  ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_find_instance"
        );
LAB_001675d9:
  ly_set_free(set);
  ly_set_free(set_00);
  return (ly_set *)0x0;
}

Assistant:

ly_set *
lyd_find_instance(const struct lyd_node *data, const struct lys_node *schema)
{
    struct ly_set *ret, *ret_aux, *spath;
    const struct lys_node *siter;
    struct lyd_node *iter;
    unsigned int i, j;

    if (!data || !schema ||
            !(schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION))) {
        LOGARG;
        return NULL;
    }

    ret = ly_set_new();
    spath = ly_set_new();
    if (!ret || !spath) {
        LOGMEM(schema->module->ctx);
        goto error;
    }

    /* find data root */
    while (data->parent) {
        /* vertical move (up) */
        data = data->parent;
    }
    while (data->prev->next) {
        /* horizontal move (left) */
        data = data->prev;
    }

    /* build schema path */
    for (siter = schema; siter; ) {
        if (siter->nodetype == LYS_AUGMENT) {
            siter = ((struct lys_node_augment *)siter)->target;
            continue;
        } else if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
            /* standard data node */
            ly_set_add(spath, (void*)siter, LY_SET_OPT_USEASLIST);

        } /* else skip the rest node types */
        siter = siter->parent;
    }
    if (!spath->number) {
        /* no valid path */
        goto error;
    }

    /* start searching */
    LY_TREE_FOR((struct lyd_node *)data, iter) {
        if (iter->schema == spath->set.s[spath->number - 1]) {
            ly_set_add(ret, iter, LY_SET_OPT_USEASLIST);
        }
    }
    for (i = spath->number - 1; i; i--) {
        if (!ret->number) {
            /* nothing found */
            break;
        }

        ret_aux = ly_set_new();
        if (!ret_aux) {
            LOGMEM(schema->module->ctx);
            goto error;
        }
        for (j = 0; j < ret->number; j++) {
            LY_TREE_FOR(ret->set.d[j]->child, iter) {
                if (iter->schema == spath->set.s[i - 1]) {
                    ly_set_add(ret_aux, iter, LY_SET_OPT_USEASLIST);
                }
            }
        }
        ly_set_free(ret);
        ret = ret_aux;
    }

    ly_set_free(spath);
    return ret;

error:
    ly_set_free(ret);
    ly_set_free(spath);

    return NULL;
}